

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

void __thiscall
ThreadedReplayer::run_creation_work_item_compute_iteration
          (ThreadedReplayer *this,PipelineWorkItem *work_item,VkPipelineCache cache,bool primary)

{
  atomic<unsigned_int> *paVar1;
  SharedControlBlock *pSVar2;
  VkResult VVar3;
  long lVar4;
  long lVar5;
  PipelineFeedback feedback;
  
  reset_work_item(this,work_item);
  lVar4 = std::chrono::_V2::steady_clock::now();
  PipelineFeedback::PipelineFeedback(&feedback);
  if (((this->disk_pipeline_cache != (VkPipelineCache)0x0) || ((this->opts).pipeline_stats == true))
     && (((this->device)._M_t.
          super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
          ._M_t.
          super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
          .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
         supports_pipeline_feedback == true)) {
    PipelineFeedback::setup_pnext(&feedback,work_item);
  }
  VVar3 = (*vkCreateComputePipelines)
                    (((this->device)._M_t.
                      super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                      .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device
                     ,cache,1,(VkComputePipelineCreateInfo *)
                              (work_item->create_info).graphics_create_info,
                     (VkAllocationCallbacks *)0x0,(work_item->output).pipeline);
  if (VVar3 == VK_SUCCESS) {
    lVar5 = std::chrono::_V2::steady_clock::now();
    LOCK();
    (this->compute_pipeline_ns).super___atomic_base<unsigned_long>._M_i =
         (this->compute_pipeline_ns).super___atomic_base<unsigned_long>._M_i + (lVar5 - lVar4);
    UNLOCK();
    LOCK();
    (this->compute_pipeline_count).super___atomic_base<unsigned_int>._M_i =
         (this->compute_pipeline_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    if (primary) {
      if ((this->opts).pipeline_stats == true) {
        get_pipeline_stats(this,work_item->tag,work_item->hash,*(work_item->output).pipeline,
                           &feedback,lVar5 - lVar4);
      }
      pSVar2 = (this->opts).control_block;
      if (pSVar2 != (SharedControlBlock *)0x0) {
        LOCK();
        paVar1 = &pSVar2->successful_compute;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      check_pipeline_cache_feedback(this,&feedback);
    }
    complete_work_item(this,work_item);
  }
  else {
    fprintf(_stderr,"Fossilize ERROR: Failed to create compute pipeline for hash 0x%016lx.\n",
            work_item->hash);
    fflush(_stderr);
  }
  return;
}

Assistant:

void run_creation_work_item_compute_iteration(const PipelineWorkItem &work_item, VkPipelineCache cache, bool primary)
	{
		reset_work_item(work_item);

		auto start_time = chrono::steady_clock::now();

#ifdef SIMULATE_UNSTABLE_DRIVER
		spurious_crash();
#endif
		PipelineFeedback feedback;
		if ((disk_pipeline_cache || opts.pipeline_stats) && device->pipeline_feedback_enabled())
			feedback.setup_pnext(work_item);

		if (vkCreateComputePipelines(device->get_device(), cache, 1,
									 work_item.create_info.compute_create_info,
									 nullptr, work_item.output.pipeline) == VK_SUCCESS)
		{
			auto end_time = chrono::steady_clock::now();
			auto duration_ns = chrono::duration_cast<chrono::nanoseconds>(end_time - start_time).count();

			compute_pipeline_ns.fetch_add(duration_ns, std::memory_order_relaxed);
			compute_pipeline_count.fetch_add(1, std::memory_order_relaxed);

			if (primary)
			{
				if (opts.pipeline_stats)
					get_pipeline_stats(work_item.tag, work_item.hash, *work_item.output.pipeline, feedback, duration_ns);
				if (opts.control_block)
					opts.control_block->successful_compute.fetch_add(1, std::memory_order_relaxed);
				check_pipeline_cache_feedback(feedback);
			}

			complete_work_item(work_item);
		}
		else
		{
			LOGE("Failed to create compute pipeline for hash 0x%016" PRIx64 ".\n", work_item.hash);
		}
	}